

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

void updatewindow(zng_stream *strm,uint8_t *end,uint32_t len,int32_t cksum)

{
  internal_state *piVar1;
  internal_state *piVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  ulong uVar8;
  uint uVar9;
  
  piVar1 = strm->state;
  if (piVar1->w_size == 0) {
    piVar1->w_size = 1 << ((byte)piVar1->block_open & 0x1f);
  }
  uVar9 = piVar1->w_size;
  if (len < uVar9) {
    uVar9 = uVar9 - piVar1->lookahead;
    uVar3 = len;
    if (uVar9 < len) {
      uVar3 = uVar9;
    }
    uVar8 = (ulong)uVar3;
    puVar7 = (uint8_t *)((ulong)piVar1->lookahead + *(long *)&piVar1->high_water);
    puVar6 = end + -(ulong)len;
    if (cksum == 0) {
      memcpy(puVar7,puVar6,uVar8);
    }
    else if (uVar3 != 0) {
      if (piVar1->pending_buf_size == 0) {
        uVar4 = (*functable.adler32_fold_copy)(piVar1->wrap,puVar7,puVar6,uVar8);
        piVar1->wrap = (int)(ulong)uVar4;
        piVar1->gzindex = (int)((ulong)uVar4 >> 0x20);
        strm->adler = uVar4;
      }
      else {
        (*functable.crc32_fold_copy)((crc32_fold_s *)&piVar1->level,puVar7,puVar6,uVar8);
      }
    }
    if (len <= uVar9) {
      uVar5 = piVar1->lookahead + uVar3;
      uVar9 = 0;
      if (uVar5 != piVar1->w_size) {
        uVar9 = uVar5;
      }
      piVar1->lookahead = uVar9;
      if (piVar1->w_size <= piVar1->w_mask) {
        return;
      }
      uVar3 = piVar1->w_mask + uVar3;
      goto LAB_0010ac25;
    }
    uVar8 = (ulong)(len - uVar3);
    puVar7 = end + -uVar8;
    puVar6 = *(uint8_t **)&piVar1->high_water;
    if (cksum == 0) {
      memcpy(puVar6,puVar7,uVar8);
    }
    else if (uVar9 < len) {
      piVar2 = strm->state;
      if (piVar2->pending_buf_size == 0) {
        uVar4 = (*functable.adler32_fold_copy)(piVar2->wrap,puVar6,puVar7,uVar8);
        piVar2->wrap = (int)(ulong)uVar4;
        piVar2->gzindex = (int)((ulong)uVar4 >> 0x20);
        strm->adler = uVar4;
      }
      else {
        (*functable.crc32_fold_copy)((crc32_fold_s *)&piVar2->level,puVar6,puVar7,uVar8);
      }
    }
    piVar1->lookahead = len - uVar3;
  }
  else {
    if (cksum == 0) {
      memcpy(*(void **)&piVar1->high_water,end + -(ulong)uVar9,(ulong)uVar9);
    }
    else {
      if (uVar9 < len) {
        if (piVar1->pending_buf_size == 0) {
          uVar4 = (*functable.adler32)(piVar1->wrap,end + -(ulong)len,(ulong)(len - uVar9));
          piVar1->wrap = (int)(ulong)uVar4;
          piVar1->gzindex = (int)((ulong)uVar4 >> 0x20);
          strm->adler = uVar4;
        }
        else {
          (*functable.crc32_fold)
                    ((crc32_fold_s *)&piVar1->level,end + -(ulong)len,(ulong)(len - uVar9),0);
        }
      }
      uVar8 = (ulong)piVar1->w_size;
      if (uVar8 != 0) {
        piVar2 = strm->state;
        if (piVar2->pending_buf_size == 0) {
          uVar4 = (*functable.adler32_fold_copy)
                            (piVar2->wrap,*(uint8_t **)&piVar1->high_water,end + -uVar8,uVar8);
          piVar2->wrap = (int)(ulong)uVar4;
          piVar2->gzindex = (int)((ulong)uVar4 >> 0x20);
          strm->adler = uVar4;
        }
        else {
          (*functable.crc32_fold_copy)
                    ((crc32_fold_s *)&piVar2->level,*(uint8_t **)&piVar1->high_water,end + -uVar8,
                     uVar8);
        }
      }
    }
    piVar1->lookahead = 0;
  }
  uVar3 = piVar1->w_size;
LAB_0010ac25:
  piVar1->w_mask = uVar3;
  return;
}

Assistant:

static void updatewindow(PREFIX3(stream) *strm, const uint8_t *end, uint32_t len, int32_t cksum) {
    struct inflate_state *state;
    uint32_t dist;

    state = (struct inflate_state *)strm->state;

    /* if window not in use yet, initialize */
    if (state->wsize == 0)
        state->wsize = 1U << state->wbits;

    /* len state->wsize or less output bytes into the circular window */
    if (len >= state->wsize) {
        /* Only do this if the caller specifies to checksum bytes AND the platform requires
         * it (s/390 being the primary exception to this) */
        if (INFLATE_NEED_CHECKSUM(strm) && cksum) {
            /* We have to split the checksum over non-copied and copied bytes */
            if (len > state->wsize)
                inf_chksum(strm, end - len, len - state->wsize);
            inf_chksum_cpy(strm, state->window, end - state->wsize, state->wsize);
        } else {
            memcpy(state->window, end - state->wsize, state->wsize);
        }

        state->wnext = 0;
        state->whave = state->wsize;
    } else {
        dist = state->wsize - state->wnext;
        /* Only do this if the caller specifies to checksum bytes AND the platform requires
         * We need to maintain the correct order here for the checksum */
        dist = MIN(dist, len);
        if (INFLATE_NEED_CHECKSUM(strm) && cksum) {
            inf_chksum_cpy(strm, state->window + state->wnext, end - len, dist);
        } else {
            memcpy(state->window + state->wnext, end - len, dist);
        }
        len -= dist;
        if (len) {
            if (INFLATE_NEED_CHECKSUM(strm) && cksum) {
                inf_chksum_cpy(strm, state->window, end - len, len);
            } else {
                memcpy(state->window, end - len, len);
            }

            state->wnext = len;
            state->whave = state->wsize;
        } else {
            state->wnext += dist;
            if (state->wnext == state->wsize)
                state->wnext = 0;
            if (state->whave < state->wsize)
                state->whave += dist;
        }
    }
}